

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void ly_ext_log(ly_ctx *ctx,char *plugin_name,LY_LOG_LEVEL level,LY_ERR err,char *data_path,
               char *schema_path,uint64_t line,char *format,__va_list_tag *ap)

{
  int iVar1;
  LY_ERR LVar2;
  char *local_40;
  char *plugin_msg;
  char *schema_path_local;
  char *data_path_local;
  LY_ERR err_local;
  LY_LOG_LEVEL level_local;
  char *plugin_name_local;
  ly_ctx *ctx_local;
  
  if (level <= ly_ll) {
    plugin_msg = schema_path;
    schema_path_local = data_path;
    data_path_local._0_4_ = err;
    data_path_local._4_4_ = level;
    _err_local = plugin_name;
    plugin_name_local = (char *)ctx;
    iVar1 = asprintf(&local_40,"Ext plugin \"%s\": %s",plugin_name,format);
    if (iVar1 == -1) {
      ly_log((ly_ctx *)plugin_name_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "ly_ext_log");
    }
    else {
      LVar2 = LY_SUCCESS;
      if (data_path_local._4_4_ == LY_LLERR) {
        LVar2 = LY_EPLUGIN;
      }
      log_vprintf((ly_ctx *)plugin_name_local,data_path_local._4_4_,LVar2 | (LY_ERR)data_path_local,
                  LYVE_OTHER,schema_path_local,plugin_msg,line,(char *)0x0,local_40,ap);
      free(local_40);
    }
  }
  return;
}

Assistant:

static void
ly_ext_log(const struct ly_ctx *ctx, const char *plugin_name, LY_LOG_LEVEL level, LY_ERR err, char *data_path,
        char *schema_path, uint64_t line, const char *format, va_list ap)
{
    char *plugin_msg;

    if (ATOMIC_LOAD_RELAXED(ly_ll) < level) {
        return;
    }
    if (asprintf(&plugin_msg, "Ext plugin \"%s\": %s", plugin_name, format) == -1) {
        LOGMEM(ctx);
        return;
    }

    log_vprintf(ctx, level, (level == LY_LLERR ? LY_EPLUGIN : 0) | err, LYVE_OTHER, data_path, schema_path, line, NULL,
            plugin_msg, ap);
    free(plugin_msg);
}